

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

int read_UTF8_ch(char **st)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  int ch;
  int ch_2;
  int ch_1;
  char **s;
  char **st_local;
  
  if (((int)**st & 0x80U) == 0) {
    pcVar4 = *st;
    *st = pcVar4 + 1;
    st_local._4_4_ = (uint)*pcVar4;
  }
  else if (((int)**st & 0xe0U) == 0xc0) {
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar1 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    st_local._4_4_ = ((int)cVar1 & 0x1fU) << 6 | (int)*pcVar4 & 0x3fU;
  }
  else if (((int)**st & 0xf0U) == 0xe0) {
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar1 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar2 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    st_local._4_4_ = ((int)cVar2 & 0x3fU) << 6 | ((int)cVar1 & 0xfU) << 0xc | (int)*pcVar4 & 0x3fU;
  }
  else {
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar1 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar2 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    cVar3 = *pcVar4;
    pcVar4 = *st;
    *st = pcVar4 + 1;
    st_local._4_4_ =
         ((int)cVar3 & 0x3fU) << 6 | ((int)cVar2 & 0x3fU) << 0xc | ((int)cVar1 & 7U) << 0x12 |
         (int)*pcVar4 & 0x3fU;
  }
  return st_local._4_4_;
}

Assistant:

int read_UTF8_ch(const char** st) {
    const char*& s = *st;
    if ((*s & 0x80) == 0)
        return *s++;
    if ((*s & 0xE0) == 0xC0) {
        int ch = (*s++ & 0x1F) << 6;
        return ch | (*s++ & 0x3F);
    }
    if ((*s & 0xF0) == 0xE0) {
        int ch = (*s++ & 0x0F) << 12;
        ch |= (*s++ & 0x3F) << 6;
        return ch | (*s++ & 0x3F);
    }
    int ch = (*s++ & 0x07) << 18;
    ch |= (*s++ & 0x3F) << 12;
    ch |= (*s++ & 0x3F) << 6;
    return ch | (*s++ & 0x3F);
}